

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshrand.c
# Opt level: O1

void random_clear(void)

{
  if (global_prng != (prng *)0x0) {
    random_save_seed();
    expire_timer_context(&random_timer_ctx);
    prng_free(global_prng);
    global_prng = (prng *)0x0;
    random_active = 0;
  }
  return;
}

Assistant:

void random_clear(void)
{
    if (global_prng) {
        random_save_seed();
        expire_timer_context(&random_timer_ctx);
        prng_free(global_prng);
        global_prng = NULL;
        random_active = 0;
    }
}